

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CMU462::HalfedgeElement::translatePoint
          (HalfedgeElement *this,Vector3D *p,double dx,double dy,Matrix4x4 *modelViewProj)

{
  double dVar1;
  double dVar2;
  undefined1 local_e8 [24];
  double dStack_d0;
  double local_c0;
  double dStack_b8;
  Matrix4x4 local_a0;
  
  local_e8._0_8_ = p->x;
  local_e8._8_8_ = p->y;
  local_e8._16_8_ = p->z;
  dStack_d0 = 1.0;
  Matrix4x4::operator*(modelViewProj,(Vector4D *)local_e8);
  dVar2 = 1.0 / local_a0.entries[0].w;
  local_e8._0_8_ = (dVar2 * local_a0.entries[0].x + dx) * local_a0.entries[0].w;
  local_e8._8_8_ = (dVar2 * local_a0.entries[0].y + dy) * local_a0.entries[0].w;
  dVar1 = local_a0.entries[0].w * dVar2 * local_a0.entries[0].w;
  unique0x100000b8 = SUB84(dVar1,0);
  local_e8._16_8_ = local_a0.entries[0].z * dVar2 * local_a0.entries[0].w;
  unique0x100000bc = (int)((ulong)dVar1 >> 0x20);
  Matrix4x4::inv(&local_a0,modelViewProj);
  Matrix4x4::operator*(&local_a0,(Vector4D *)local_e8);
  local_e8._0_8_ = local_c0;
  local_e8._8_8_ = dStack_b8;
  Vector4D::to3D((Vector4D *)local_e8);
  p->z = local_a0.entries[0].z;
  p->x = local_a0.entries[0].x;
  p->y = local_a0.entries[0].y;
  return;
}

Assistant:

void HalfedgeElement::translatePoint( Vector3D& p, double dx, double dy, const Matrix4x4& modelViewProj )
  {
    Vector4D q( p, 1. );

    // Transform into clip space
    q = modelViewProj * q;
    double w = q.w;
    q /= w;

    // Shift by (dx, dy).
    q.x += dx;
    q.y += dy;

    // Transform back into model space
    q *= w;
    q = modelViewProj.inv() * q;

    p = q.to3D();
  }